

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-fds.c
# Opt level: O1

lws * wsi_from_fd(lws_context *context,int fd)

{
  lws *plVar1;
  long lVar2;
  
  if ((context->field_0x7b8 & 4) == 0) {
    return context->lws_lookup[fd];
  }
  if ((ulong)context->max_fds != 0) {
    lVar2 = 0;
    do {
      plVar1 = *(lws **)((long)context->lws_lookup + lVar2);
      if ((plVar1 != (lws *)0x0) && ((plVar1->desc).sockfd == fd)) {
        return plVar1;
      }
      lVar2 = lVar2 + 8;
    } while ((ulong)context->max_fds << 3 != lVar2);
  }
  return (lws *)0x0;
}

Assistant:

struct lws *
wsi_from_fd(const struct lws_context *context, int fd)
{
	struct lws **p, **done;

	if (!context->max_fds_unrelated_to_ulimit)
		return context->lws_lookup[fd - lws_plat_socket_offset()];

	/* slow fds handling */

	p = context->lws_lookup;
	done = &p[context->max_fds];

	while (p != done) {
		if (*p && (*p)->desc.sockfd == fd)
			return *p;
		p++;
	}

	return NULL;
}